

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcore_builder.cpp
# Opt level: O2

void * rtcThreadLocalAlloc(RTCThreadLocalAllocator localAllocator,size_t bytes,size_t align)

{
  atomic<unsigned_long> *paVar1;
  FastAllocator *this;
  undefined8 *puVar2;
  value_type this_00;
  size_t sVar3;
  ulong uVar4;
  void *pvVar5;
  long lVar6;
  ulong uVar7;
  MutexSys *pMVar8;
  Lock<embree::MutexSys> local_60;
  size_t local_50;
  Lock<embree::MutexSys> local_48;
  value_type local_38;
  
  this = *(FastAllocator **)localAllocator;
  puVar2 = *(undefined8 **)(localAllocator + 8);
  this_00 = (value_type)*puVar2;
  local_50 = bytes;
  if (this != (this_00->alloc)._M_b._M_p) {
    local_48.locked = true;
    local_48.mutex = (MutexSys *)this_00;
    embree::MutexSys::lock((MutexSys *)this_00);
    if ((this_00->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesUsed + (this_00->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_00->alloc0).end + (this_00->alloc1).end) -
           ((this_00->alloc0).cur + (this_00->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesWasted + (this_00->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_00->alloc0).bytesUsed = 0;
    (this_00->alloc0).bytesWasted = 0;
    (this_00->alloc0).end = 0;
    (this_00->alloc0).allocBlockSize = 0;
    (this_00->alloc0).ptr = (char *)0x0;
    (this_00->alloc0).cur = 0;
    if (this == (FastAllocator *)0x0) {
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
    }
    else {
      (this_00->alloc0).allocBlockSize = this->defaultBlockSize;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).allocBlockSize = this->defaultBlockSize;
    }
    LOCK();
    (this_00->alloc)._M_b._M_p = this;
    UNLOCK();
    local_60.mutex = (MutexSys *)&embree::FastAllocator::s_thread_local_allocators_lock;
    local_60.locked = true;
    local_38 = this_00;
    embree::MutexSys::lock((MutexSys *)&embree::FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&this->thread_local_allocators,&local_38);
    embree::Lock<embree::MutexSys>::~Lock(&local_60);
    embree::Lock<embree::MutexSys>::~Lock(&local_48);
  }
  sVar3 = local_50;
  puVar2[5] = puVar2[5] + local_50;
  lVar6 = puVar2[2];
  uVar7 = align - lVar6 & align - 1;
  uVar4 = lVar6 + local_50 + uVar7;
  puVar2[2] = uVar4;
  if ((ulong)puVar2[3] < uVar4) {
    puVar2[2] = lVar6;
    pMVar8 = (MutexSys *)puVar2[4];
    if ((MutexSys *)(local_50 * 4) < pMVar8 || (long)(local_50 * 4) - (long)pMVar8 == 0) {
      local_60.mutex = pMVar8;
      pvVar5 = embree::FastAllocator::malloc(this,(size_t)&local_60);
      puVar2[1] = pvVar5;
      lVar6 = (puVar2[3] - puVar2[2]) + puVar2[6];
      puVar2[6] = lVar6;
      puVar2[3] = local_60.mutex;
      uVar4 = align - 1 & align;
      pMVar8 = (MutexSys *)(sVar3 + uVar4);
      puVar2[2] = pMVar8;
      if (local_60.mutex < pMVar8) {
        puVar2[2] = 0;
        local_60.mutex = (MutexSys *)puVar2[4];
        pvVar5 = embree::FastAllocator::malloc(this,(size_t)&local_60);
        puVar2[1] = pvVar5;
        lVar6 = (puVar2[3] - puVar2[2]) + puVar2[6];
        puVar2[6] = lVar6;
        puVar2[3] = local_60.mutex;
        puVar2[2] = pMVar8;
        if (local_60.mutex < pMVar8) {
          puVar2[2] = 0;
          return (void *)0x0;
        }
      }
      puVar2[6] = lVar6 + uVar4;
      pvVar5 = (void *)((long)pvVar5 + uVar4);
    }
    else {
      pvVar5 = embree::FastAllocator::malloc(this,(size_t)&local_50);
    }
  }
  else {
    puVar2[6] = puVar2[6] + uVar7;
    pvVar5 = (void *)((uVar4 - local_50) + puVar2[1]);
  }
  return pvVar5;
}

Assistant:

RTC_API void* rtcThreadLocalAlloc(RTCThreadLocalAllocator localAllocator, size_t bytes, size_t align)
    {
      FastAllocator::CachedAllocator* alloc = (FastAllocator::CachedAllocator*) localAllocator;
      RTC_CATCH_BEGIN;
      RTC_TRACE(rtcThreadLocalAlloc);
      return alloc->malloc0(bytes,align);
      RTC_CATCH_END(alloc->alloc->getDevice());
      return nullptr;
    }